

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDocumentation.cxx
# Opt level: O0

void __thiscall cmDocumentation::cmDocumentation(cmDocumentation *this)

{
  cmDocumentation *this_local;
  
  std::__cxx11::string::string((string *)&this->NameString);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDocumentationSection,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDocumentationSection>_>_>
  ::map(&this->AllSections);
  std::__cxx11::string::string((string *)&this->CurrentArgument);
  std::
  vector<cmDocumentation::RequestedHelpItem,_std::allocator<cmDocumentation::RequestedHelpItem>_>::
  vector(&this->RequestedHelpItems);
  cmDocumentationFormatter::cmDocumentationFormatter(&this->Formatter);
  addCommonStandardDocSections(this);
  this->ShowGenerators = true;
  return;
}

Assistant:

cmDocumentation::cmDocumentation()
{
  this->addCommonStandardDocSections();
  this->ShowGenerators = true;
}